

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDfs.c
# Opt level: O1

Vec_Wec_t * Gia_ManLevelizeR(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  Vec_Wec_t *pVVar6;
  Vec_Int_t *pVVar7;
  long lVar8;
  long lVar9;
  Gia_Obj_t *pObj;
  
  uVar3 = Gia_ManLevelRNum(p);
  pVVar6 = (Vec_Wec_t *)malloc(0x10);
  iVar4 = 8;
  if (6 < uVar3) {
    iVar4 = uVar3 + 1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar4;
  if (iVar4 == 0) {
    pVVar7 = (Vec_Int_t *)0x0;
  }
  else {
    pVVar7 = (Vec_Int_t *)calloc((long)iVar4,0x10);
  }
  pVVar6->pArray = pVVar7;
  pVVar6->nSize = uVar3 + 1;
  if (0 < p->nObjs) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      if (p->pObjs == (Gia_Obj_t *)0x0) {
        return pVVar6;
      }
      if ((lVar9 != 0) &&
         ((pObj = (Gia_Obj_t *)(&p->pObjs->field_0x0 + lVar8),
          (int)*(uint *)pObj < 0 && (~*(uint *)pObj & 0x1fffffff) != 0 ||
          (iVar4 = Gia_ObjLevel(p,pObj), iVar4 != 0)))) {
        uVar5 = Gia_ObjLevel(p,pObj);
        if ((int)uVar3 < (int)uVar5) {
          __assert_fail("Level <= nLevels",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaDfs.c"
                        ,0x1ba,"Vec_Wec_t *Gia_ManLevelizeR(Gia_Man_t *)");
        }
        if (pVVar6->nSize <= (int)uVar5) {
          iVar4 = uVar5 + 1;
          iVar2 = pVVar6->nSize * 2;
          if (iVar2 <= iVar4) {
            iVar2 = iVar4;
          }
          iVar1 = pVVar6->nCap;
          if (iVar1 < iVar2) {
            if (pVVar6->pArray == (Vec_Int_t *)0x0) {
              pVVar7 = (Vec_Int_t *)malloc((long)iVar2 << 4);
            }
            else {
              pVVar7 = (Vec_Int_t *)realloc(pVVar6->pArray,(long)iVar2 << 4);
            }
            pVVar6->pArray = pVVar7;
            memset(pVVar7 + iVar1,0,(long)(iVar2 - iVar1) << 4);
            pVVar6->nCap = iVar2;
          }
          pVVar6->nSize = iVar4;
        }
        if (((int)uVar5 < 0) || (pVVar6->nSize <= (int)uVar5)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                        ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
        }
        Vec_IntPush(pVVar6->pArray + uVar5,(int)lVar9);
      }
      lVar9 = lVar9 + 1;
      lVar8 = lVar8 + 0xc;
    } while (lVar9 < p->nObjs);
  }
  return pVVar6;
}

Assistant:

Vec_Wec_t * Gia_ManLevelizeR( Gia_Man_t * p )
{ 
    Gia_Obj_t * pObj;
    Vec_Wec_t * vLevels;
    int nLevels, Level, i;
    nLevels = Gia_ManLevelRNum( p );
    vLevels = Vec_WecStart( nLevels + 1 );
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( i == 0 || (!Gia_ObjIsCo(pObj) && !Gia_ObjLevel(p, pObj)) )
            continue;
        Level = Gia_ObjLevel( p, pObj );
        assert( Level <= nLevels );
        Vec_WecPush( vLevels, Level, i );
    }
    return vLevels;
}